

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O1

string * duckdb::AddEscapes(string *__return_storage_ptr__,char to_be_escaped,char escape,
                           string *val)

{
  ulong uVar1;
  undefined7 in_register_00000031;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = CONCAT71(in_register_00000031,to_be_escaped) & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_647c332 + 9);
  uVar5 = 0;
  uVar1 = ::std::__cxx11::string::find((char)val,uVar3);
  cVar2 = (char)__return_storage_ptr__;
  if (uVar1 != 0xffffffffffffffff) {
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if (uVar5 < uVar1) {
        do {
          ::std::__cxx11::string::push_back(cVar2);
          uVar4 = uVar4 + 1;
          uVar5 = uVar1;
        } while (uVar1 != uVar4);
      }
      if (escape != '\0') {
        ::std::__cxx11::string::push_back(cVar2);
        uVar1 = ::std::__cxx11::string::find((char)val,(ulong)(uint)(int)(char)uVar3);
      }
    } while (uVar1 != 0xffffffffffffffff);
  }
  for (; uVar5 < val->_M_string_length; uVar5 = uVar5 + 1) {
    ::std::__cxx11::string::push_back(cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static string AddEscapes(char to_be_escaped, const char escape, const string &val) {
	idx_t i = 0;
	string new_val = "";
	idx_t found = val.find(to_be_escaped);

	while (found != string::npos) {
		while (i < found) {
			new_val += val[i];
			i++;
		}
		if (escape != '\0') {
			new_val += escape;
			found = val.find(to_be_escaped, found + 1);
		}
	}
	while (i < val.length()) {
		new_val += val[i];
		i++;
	}
	return new_val;
}